

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int fdParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int size;
  char *base;
  
  base = (char *)0x0;
  nb_tests = nb_tests + 1;
  iVar1 = open64(filename,0);
  if (((uint)options >> 0x18 & 1) == 0) {
    lVar2 = xmlReadFd();
  }
  else {
    lVar2 = htmlReadFd(iVar1,filename,0,options);
  }
  close(iVar1);
  if (result == (char *)0x0) {
    bVar3 = true;
  }
  else {
    if (lVar2 == 0) {
      base = "";
      size = 0;
    }
    else if (((uint)options >> 0x18 & 1) == 0) {
      xmlDocDumpMemory();
    }
    else {
      htmlDocDumpMemory(lVar2,&base,&size);
    }
    iVar1 = compareFileMem(result,base,size);
    bVar3 = iVar1 == 0;
  }
  if (lVar2 != 0) {
    if (base != (char *)0x0) {
      (*_xmlFree)();
    }
    xmlFreeDoc(lVar2);
  }
  if (bVar3) {
    if (err == (char *)0x0) {
      if ((options & 0x10U) == 0) {
        return 0;
      }
      if (testErrorsSize == 0) {
        return 0;
      }
      fprintf(_stderr,"Validation for %s failed\n",filename);
      return 0;
    }
    iVar1 = compareFileMem(err,testErrors,testErrorsSize);
    if (iVar1 == 0) {
      return 0;
    }
    fprintf(_stderr,"Error for %s failed\n",filename);
  }
  else {
    fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
  }
  return -1;
}

Assistant:

static int
fdParseTest(const char *filename, const char *result, const char *err,
             int options) {
    xmlDocPtr doc;
    const char *base = NULL;
    int size, res = 0, fd;

    nb_tests++;
    fd = open(filename, RD_FLAGS);
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        doc = htmlReadFd(fd, filename, NULL, options);
    } else
#endif
    {
	doc = xmlReadFd(fd, filename, NULL, options);
    }
    close(fd);
    if (result) {
	if (doc == NULL) {
	    base = "";
	    size = 0;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML) {
		htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
	    } else
#endif
	    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
	}
	res = compareFileMem(result, base, size);
    }
    if (doc != NULL) {
	if (base != NULL)
	    xmlFree((char *)base);
	xmlFreeDoc(doc);
    }
    if (res != 0) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        return(-1);
    }
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    } else if (options & XML_PARSE_DTDVALID) {
        if (testErrorsSize != 0)
	    fprintf(stderr, "Validation for %s failed\n", filename);
    }

    return(0);
}